

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O3

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
compute_average(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,
               vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
               *to_average)

{
  pointer ppVVar1;
  Vector_distances_in_diagram<Gudhi::Euclidean_distance> *pVVar2;
  pointer ppVVar3;
  pointer pdVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer pdVar7;
  long lVar8;
  ulong uVar9;
  size_t i;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  vector<double,_std::allocator<double>_> av;
  allocator_type local_49;
  vector<double,_std::allocator<double>_> local_48;
  value_type_conflict1 local_30;
  
  ppVVar1 = (to_average->
            super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(to_average->
                super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1;
  if (lVar8 == 0) {
    ppVar5 = (this->intervals).
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar6 = (this->intervals).
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->intervals).
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->intervals).
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->intervals).
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppVar5 != (pointer)0x0) {
      operator_delete(ppVar5,(long)ppVar6 - (long)ppVar5);
    }
    pdVar4 = (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pdVar4 != (pointer)0x0) {
      operator_delete(pdVar4,(long)pdVar7 - (long)pdVar4);
      return;
    }
  }
  else {
    lVar10 = 0;
    uVar9 = 0;
    do {
      uVar15 = uVar9;
      pVVar2 = ppVVar1[lVar10];
      uVar14 = (long)*(pointer *)
                      ((long)&(pVVar2->sorted_vector_of_distances).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) -
               *(long *)&(pVVar2->sorted_vector_of_distances).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data >> 3;
      uVar9 = uVar15;
      if (uVar15 < uVar14) {
        uVar9 = uVar14;
      }
      lVar10 = lVar10 + 1;
    } while (lVar8 >> 3 != lVar10);
    local_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector(&local_48,uVar9,&local_30,&local_49);
    ppVVar1 = (to_average->
              super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVVar3 = (to_average->
              super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = (long)ppVVar3 - (long)ppVVar1;
    lVar10 = lVar8 >> 3;
    if (ppVVar3 != ppVVar1) {
      lVar11 = 0;
      do {
        pdVar4 = (ppVVar1[lVar11]->sorted_vector_of_distances).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar12 = (long)(ppVVar1[lVar11]->sorted_vector_of_distances).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar4;
        if (lVar12 != 0) {
          lVar13 = 0;
          do {
            local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar13] =
                 pdVar4[lVar13] +
                 local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar12 >> 3 != lVar13);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar10);
    }
    if (uVar9 != 0) {
      auVar16._8_4_ = (int)(lVar8 >> 0x23);
      auVar16._0_8_ = lVar10;
      auVar16._12_4_ = 0x45300000;
      if (uVar14 < uVar15) {
        uVar14 = uVar15;
      }
      uVar9 = 0;
      do {
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar9] =
             local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] /
             ((auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
        uVar9 = uVar9 + 1;
      } while (uVar14 != uVar9);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              (&this->sorted_vector_of_distances,&local_48);
    this->where_to_cut =
         (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start >> 3;
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Vector_distances_in_diagram<F>::compute_average(const std::vector<Vector_distances_in_diagram*>& to_average) {
  if (to_average.size() == 0) {
    (*this) = Vector_distances_in_diagram<F>();
    return;
  }

  size_t maximal_length_of_vector = 0;
  for (size_t i = 0; i != to_average.size(); ++i) {
    if (to_average[i]->sorted_vector_of_distances.size() > maximal_length_of_vector) {
      maximal_length_of_vector = to_average[i]->sorted_vector_of_distances.size();
    }
  }

  std::vector<double> av(maximal_length_of_vector, 0);
  for (size_t i = 0; i != to_average.size(); ++i) {
    for (size_t j = 0; j != to_average[i]->sorted_vector_of_distances.size(); ++j) {
      av[j] += to_average[i]->sorted_vector_of_distances[j];
    }
  }

  for (size_t i = 0; i != maximal_length_of_vector; ++i) {
    av[i] /= static_cast<double>(to_average.size());
  }
  this->sorted_vector_of_distances = av;
  this->where_to_cut = av.size();
}